

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

string * __thiscall
google::protobuf::Reflection::GetStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,string *scratch)

{
  ReflectionSchema *this_00;
  byte bVar1;
  void *pvVar2;
  uint32_t uVar3;
  CppStringType CVar4;
  Cord **ppCVar5;
  string *psVar6;
  ArenaStringPtr *pAVar7;
  Cord *src;
  Nonnull<const_char_*> pcVar8;
  bool bVar9;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Descriptor *pDVar10;
  Metadata MVar11;
  
  MVar11 = Message::GetMetadata(message);
  if (MVar11.reflection != this) {
    pDVar10 = this->descriptor_;
    MVar11 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar10,MVar11.descriptor,field,"GetStringReference");
  }
  pDVar10 = this->descriptor_;
  if (field->containing_type_ == pDVar10) {
    bVar1 = field->field_0x1;
    bVar9 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar9) {
      pcVar8 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar9,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar8 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (this->descriptor_,field,"GetStringReference",CPPTYPE_STRING);
        }
        this_00 = &this->schema_;
        if ((field->field_0x1 & 8) != 0) {
          uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(this_00);
          psVar6 = internal::ExtensionSet::GetString
                             ((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3)
                              ,field->number_,(field->field_20).default_value_string_);
          return psVar6;
        }
        bVar9 = internal::ReflectionSchema::InRealOneof(this_00,field);
        if (bVar9) {
          if ((field->field_0x1 & 0x10) == 0) {
            oneof_descriptor = (OneofDescriptor *)0x0;
          }
          else {
            oneof_descriptor = (field->scope_).containing_oneof;
            if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_001f524c;
          }
          uVar3 = GetOneofCase(this,message,oneof_descriptor);
          if (uVar3 != field->number_) goto LAB_001f5196;
        }
        CVar4 = FieldDescriptor::cpp_string_type(field);
        if ((CVar4 != kView) && (CVar4 != kString)) {
          if (CVar4 == kCord) {
            bVar9 = internal::ReflectionSchema::InRealOneof(this_00,field);
            if (bVar9) {
              ppCVar5 = GetRaw<absl::lts_20250127::Cord*>(this,message,field);
              src = *ppCVar5;
            }
            else {
              src = GetRaw<absl::lts_20250127::Cord>(this,message,field);
            }
            absl::lts_20250127::CopyCordToString(src,scratch);
            return scratch;
          }
          GetStringReference();
LAB_001f524c:
          internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb31);
        }
        bVar9 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
        if (bVar9) {
          psVar6 = (string *)
                   GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
          return psVar6;
        }
        pAVar7 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        pvVar2 = (pAVar7->tagged_ptr_).ptr_;
        if (((ulong)pvVar2 & 3) != 0) {
          return (string *)((ulong)pvVar2 & 0xfffffffffffffffc);
        }
LAB_001f5196:
        return (string *)(field->field_20).default_value_int64_t_;
      }
    }
    else {
      GetStringReference();
    }
    pDVar10 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar10,field,"GetStringReference",description);
}

Assistant:

const std::string& Reflection::GetStringReference(const Message& message,
                                                  const FieldDescriptor* field,
                                                  std::string* scratch) const {
  (void)scratch;  // Parameter is used by Google-internal code.
  USAGE_CHECK_ALL(GetStringReference, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(
        field->number(), internal::DefaultValueStringAsString(field));
  } else {
    if (schema_.InRealOneof(field) && !HasOneofField(message, field)) {
      return internal::DefaultValueStringAsString(field);
    }
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        if (schema_.InRealOneof(field)) {
          absl::CopyCordToString(*GetField<absl::Cord*>(message, field),
                                 scratch);
        } else {
          absl::CopyCordToString(GetField<absl::Cord>(message, field), scratch);
        }
        return *scratch;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        } else if (IsMicroString(field)) {
          *scratch = std::string(GetField<MicroString>(message, field).Get());
          return *scratch;
        } else {
          const auto& str = GetField<ArenaStringPtr>(message, field);
          return str.IsDefault() ? internal::DefaultValueStringAsString(field)
                                 : str.Get();
        }
    }
    internal::Unreachable();
  }
}